

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

context_t __thiscall cs::create_context(cs *this,array *args)

{
  element_type *peVar1;
  long lVar2;
  any *paVar3;
  method_base *pmVar4;
  method_import *this_00;
  method_import_as *this_01;
  method_involve *this_02;
  domain_manager *pdVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *grammar;
  _Any_data *p_Var7;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *p_Var8;
  translator_type *this_03;
  context_t cVar9;
  initializer_list<cs::token_base_*> __l;
  initializer_list<cs::token_base_*> __l_00;
  initializer_list<cs::token_base_*> __l_01;
  initializer_list<cs::token_base_*> __l_02;
  initializer_list<cs::token_base_*> __l_03;
  initializer_list<cs::token_base_*> __l_04;
  initializer_list<cs::token_base_*> __l_05;
  initializer_list<cs::token_base_*> __l_06;
  initializer_list<cs::token_base_*> __l_07;
  initializer_list<cs::token_base_*> __l_08;
  initializer_list<cs::token_base_*> __l_09;
  initializer_list<cs::token_base_*> __l_10;
  initializer_list<cs::token_base_*> __l_11;
  initializer_list<cs::token_base_*> __l_12;
  initializer_list<cs::token_base_*> __l_13;
  initializer_list<cs::token_base_*> __l_14;
  initializer_list<cs::token_base_*> __l_15;
  initializer_list<cs::token_base_*> __l_16;
  initializer_list<cs::token_base_*> __l_17;
  initializer_list<cs::token_base_*> __l_18;
  initializer_list<cs::token_base_*> __l_19;
  initializer_list<cs::token_base_*> __l_20;
  initializer_list<cs::token_base_*> __l_21;
  initializer_list<cs::token_base_*> __l_22;
  initializer_list<cs::token_base_*> __l_23;
  initializer_list<cs::token_base_*> __l_24;
  initializer_list<cs::token_base_*> __l_25;
  initializer_list<cs::token_base_*> __l_26;
  initializer_list<cs::token_base_*> __l_27;
  initializer_list<cs::token_base_*> __l_28;
  initializer_list<cs::token_base_*> __l_29;
  initializer_list<cs::token_base_*> __l_30;
  initializer_list<cs::token_base_*> __l_31;
  initializer_list<cs::token_base_*> __l_32;
  allocator_type local_fba;
  allocator_type local_fb9;
  allocator_type local_fb8;
  allocator_type local_fb7;
  allocator_type local_fb6;
  allocator_type local_fb5;
  allocator_type local_fb4;
  allocator_type local_fb3;
  allocator_type local_fb2;
  allocator_type local_fb1;
  allocator_type local_fb0;
  allocator_type local_faf;
  allocator_type local_fae;
  allocator_type local_fad;
  allocator_type local_fac;
  allocator_type local_fab;
  allocator_type local_faa;
  allocator_type local_fa9;
  allocator_type local_fa8;
  allocator_type local_fa7;
  allocator_type local_fa6;
  allocator_type local_fa5;
  allocator_type local_fa4;
  allocator_type local_fa3;
  allocator_type local_fa2;
  allocator_type local_fa1;
  allocator_type local_fa0;
  allocator_type local_f9f;
  allocator_type local_f9e;
  allocator_type local_f9d;
  allocator_type local_f9c;
  allocator_type local_f9b;
  allocator_type local_f9a;
  allocator_type local_f99;
  tree_type<cs::token_base_*> local_f98;
  tree_type<cs::token_base_*> local_f90;
  tree_type<cs::token_base_*> local_f88;
  tree_type<cs::token_base_*> local_f80;
  tree_type<cs::token_base_*> local_f78;
  tree_type<cs::token_base_*> local_f70;
  tree_type<cs::token_base_*> local_f68;
  tree_type<cs::token_base_*> local_f60;
  tree_type<cs::token_base_*> local_f58;
  tree_type<cs::token_base_*> local_f50;
  tree_type<cs::token_base_*> local_f48;
  tree_type<cs::token_base_*> local_f40;
  tree_type<cs::token_base_*> local_f38;
  tree_type<cs::token_base_*> local_f30;
  tree_type<cs::token_base_*> local_f28;
  tree_type<cs::token_base_*> local_f20;
  tree_type<cs::token_base_*> local_f18;
  tree_type<cs::token_base_*> local_f10;
  tree_type<cs::token_base_*> local_f08;
  tree_type<cs::token_base_*> local_f00;
  tree_type<cs::token_base_*> local_ef8;
  tree_type<cs::token_base_*> local_ef0;
  tree_type<cs::token_base_*> local_ee8;
  tree_type<cs::token_base_*> local_ee0;
  tree_type<cs::token_base_*> local_ed8;
  tree_type<cs::token_base_*> local_ed0;
  tree_type<cs::token_base_*> local_ec8;
  tree_type<cs::token_base_*> local_ec0;
  tree_type<cs::token_base_*> local_eb8;
  tree_type<cs::token_base_*> local_eb0;
  tree_type<cs::token_base_*> local_ea8;
  any local_ea0;
  undefined8 *local_e98;
  undefined8 *local_e90;
  undefined8 *local_e88;
  undefined8 *local_e80;
  any local_e78;
  undefined8 *local_e70;
  undefined8 *local_e68;
  undefined8 *local_e60;
  undefined8 *local_e58;
  any local_e50;
  undefined8 *local_e48;
  undefined8 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined1 local_e28 [16];
  code *local_e18;
  code *local_e10;
  any local_dd8;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  undefined8 *local_dc0;
  undefined8 *local_db8;
  undefined8 *local_db0;
  undefined8 *local_da8;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_da0;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_d90;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_d80;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_d70;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_d60;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_d50;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_d40;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_d30;
  token_base *local_d20;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  token_base *local_cf8;
  undefined8 *local_cf0;
  undefined8 *local_ce8;
  token_base *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  token_base *local_cc8;
  undefined8 *local_cc0;
  token_base *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  token_base *local_ca0;
  undefined8 *local_c98;
  token_base *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  token_base *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  token_base *local_c58;
  undefined8 *local_c50;
  undefined8 *local_c48;
  token_base *local_c40;
  undefined8 *local_c38;
  token_base *local_c30;
  undefined8 *local_c28;
  token_base *local_c20;
  undefined8 *local_c18;
  undefined8 *local_c10;
  token_base *local_c08;
  undefined8 *local_c00;
  token_base *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  token_base *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  token_base *local_bc8;
  undefined8 *local_bc0;
  token_base *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  token_base *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  token_base *local_b88;
  undefined8 *local_b80;
  token_base *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  token_base *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  token_base *local_b48;
  undefined8 *local_b40;
  token_base *local_b38;
  undefined8 *local_b30;
  token_base *local_b28;
  undefined8 *local_b20;
  undefined8 *local_b18;
  token_base *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  token_base *local_af8;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  token_base *local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  token_base *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  token_base *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  token_base *local_a98;
  undefined8 *local_a90;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_a88;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_a38;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_9e8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_998;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_948;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_8f8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_8a8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_858;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_808;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_7b8;
  _Any_data local_768;
  code *local_758;
  code *local_750;
  _Any_data local_718;
  code *local_708;
  code *local_700;
  _Any_data local_6c8;
  code *local_6b8;
  code *local_6b0;
  _Any_data local_678;
  code *local_668;
  code *local_660;
  _Any_data local_628;
  code *local_618;
  code *local_610;
  _Any_data local_5d8;
  code *local_5c8;
  code *local_5c0;
  _Any_data local_588;
  code *local_578;
  code *local_570;
  _Any_data local_538;
  code *local_528;
  code *local_520;
  _Any_data local_4e8;
  code *local_4d8;
  code *local_4d0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_3f0;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_3a0;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_350;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_300;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_2b0;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_260;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_210;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_1c0;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_170;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_120;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_d0;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_80;
  token_base **pptVar6;
  
  cs_impl::init_extensions((cs_impl *)this);
  std::make_shared<cs::context_type>();
  std::make_shared<cs::compiler_type,std::shared_ptr<cs::context_type>&>
            ((shared_ptr<cs::context_type> *)local_e28);
  std::__shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>::operator=
            (*(__shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2> **)this,
             (__shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2> *)local_e28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e28 + 8));
  std::make_shared<cs::instance_type,std::shared_ptr<cs::context_type>&,unsigned_long&>
            ((shared_ptr<cs::context_type> *)local_e28,(unsigned_long *)this);
  std::__shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x10),
             (__shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2> *)local_e28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e28 + 8));
  cs_impl::any::
  make_constant<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&>
            ((any *)local_e28,args);
  paVar3 = (any *)(*(long *)this + 0xb0);
  if ((any *)local_e28 != paVar3) {
    peVar1 = (element_type *)paVar3->mDat;
    paVar3->mDat = (proxy *)local_e28._0_8_;
    local_e28._0_8_ = peVar1;
  }
  cs_impl::any::recycle((any *)local_e28);
  lVar2 = **(long **)this;
  local_a98 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)args);
  local_a98->line_num = 1;
  local_a98->_vptr_token_base = (_func_int **)&PTR__token_expr_00375700;
  local_a98[1]._vptr_token_base = (_func_int **)0x0;
  local_ea8.mRoot = (tree_node *)0x0;
  local_a90 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)args);
  local_a90[1] = 0;
  *local_a90 = &PTR__token_base_00373e68;
  pptVar6 = &local_a98;
  __l._M_len = 2;
  __l._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e28,__l,&local_f99)
  ;
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003748b8;
  this_03 = (translator_type *)(lVar2 + 0x30);
  grammar = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e28;
  translator_type::add_method(this_03,grammar,pmVar4);
  local_ab0 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)grammar);
  local_ab0->line_num = 1;
  local_ab0->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_ab0[1]._vptr_token_base = 0;
  local_aa8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)grammar);
  local_aa8[1] = 1;
  *local_aa8 = &PTR__token_expr_00375700;
  local_aa8[2] = 0;
  local_eb0.mRoot = (tree_node *)0x0;
  local_aa0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)grammar);
  local_aa0[1] = 0;
  *local_aa0 = &PTR__token_base_00373e68;
  pptVar6 = &local_ab0;
  __l_00._M_len = 3;
  __l_00._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_448,__l_00,
             &local_f9a);
  this_00 = (method_import *)method_base::operator_new((method_base *)0x58,(size_t)pptVar6);
  method_import::method_import(this_00);
  p_Var7 = &local_448;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,
             (method_base *)this_00);
  local_e50.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  (local_e50.mDat)->refcount = 1;
  *(undefined ***)local_e50.mDat = &PTR__token_base_00374248;
  *(undefined4 *)&(local_e50.mDat)->data = 0;
  local_e48 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_e48[1] = 1;
  *local_e48 = &PTR__token_expr_00375700;
  local_e48[2] = 0;
  local_eb8.mRoot = (tree_node *)0x0;
  local_e40 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_e40[1] = 1;
  *local_e40 = &PTR__token_base_00374248;
  *(undefined4 *)(local_e40 + 2) = 1;
  local_e38 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_e38[1] = 1;
  *local_e38 = &PTR__token_expr_00375700;
  local_e38[2] = 0;
  local_ec0.mRoot = (tree_node *)0x0;
  local_e30 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_e30[1] = 0;
  *local_e30 = &PTR__token_base_00373e68;
  paVar3 = &local_e50;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)paVar3;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_498,__l_01,
             &local_f9b);
  this_01 = (method_import_as *)method_base::operator_new((method_base *)0x58,(size_t)paVar3);
  method_import_as::method_import_as(this_01);
  p_Var7 = &local_498;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,
             (method_base *)this_01);
  local_ac8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_ac8->line_num = 1;
  local_ac8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_ac8[1]._vptr_token_base = 2;
  local_ac0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_ac0[1] = 1;
  *local_ac0 = &PTR__token_expr_00375700;
  local_ac0[2] = 0;
  local_ec8.mRoot = (tree_node *)0x0;
  local_ab8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_ab8[1] = 0;
  *local_ab8 = &PTR__token_base_00373e68;
  pptVar6 = &local_ac8;
  __l_02._M_len = 3;
  __l_02._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_4e8,__l_02,
             &local_f9c);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003749d8;
  p_Var7 = &local_4e8;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_ae0 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_ae0->line_num = 1;
  local_ae0->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_ae0[1]._vptr_token_base = 3;
  local_ad8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_ad8[1] = 1;
  *local_ad8 = &PTR__token_expr_00375700;
  local_ad8[2] = 0;
  local_ed0.mRoot = (tree_node *)0x0;
  local_ad0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_ad0[1] = 0;
  *local_ad0 = &PTR__token_base_00373e68;
  pptVar6 = &local_ae0;
  __l_03._M_len = 3;
  __l_03._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_538,__l_03,
             &local_f9d);
  this_02 = (method_involve *)method_base::operator_new((method_base *)0x58,(size_t)pptVar6);
  method_involve::method_involve(this_02);
  p_Var7 = &local_538;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,
             (method_base *)this_02);
  local_af8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_af8->line_num = 1;
  local_af8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_af8[1]._vptr_token_base = 9;
  local_af0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_af0[1] = 1;
  *local_af0 = &PTR__token_expr_00375700;
  local_af0[2] = 0;
  local_ed8.mRoot = (tree_node *)0x0;
  local_ae8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_ae8[1] = 0;
  *local_ae8 = &PTR__token_base_00373e68;
  pptVar6 = &local_af8;
  __l_04._M_len = 3;
  __l_04._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_588,__l_04,
             &local_f9e);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374a98;
  p_Var7 = &local_588;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_b10 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b10->line_num = 1;
  local_b10->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_b10[1]._vptr_token_base = 10;
  local_b08 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b08[1] = 1;
  *local_b08 = &PTR__token_expr_00375700;
  local_b08[2] = 0;
  local_ee0.mRoot = (tree_node *)0x0;
  local_b00 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_b00[1] = 0;
  *local_b00 = &PTR__token_base_00373e68;
  pptVar6 = &local_b10;
  __l_05._M_len = 3;
  __l_05._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_5d8,__l_05,
             &local_f9f);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374af8;
  p_Var7 = &local_5d8;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_b28 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b28->line_num = 1;
  local_b28->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_b28[1]._vptr_token_base = 0xb;
  local_b20 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b20[1] = 1;
  *local_b20 = &PTR__token_expr_00375700;
  local_b20[2] = 0;
  local_ee8.mRoot = (tree_node *)0x0;
  local_b18 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_b18[1] = 0;
  *local_b18 = &PTR__token_base_00373e68;
  pptVar6 = &local_b28;
  __l_06._M_len = 3;
  __l_06._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_628,__l_06,
             &local_fa0);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374b58;
  p_Var7 = &local_628;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_b38 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b38->line_num = 1;
  local_b38->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_b38[1]._vptr_token_base = 8;
  local_b30 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_b30[1] = 0;
  *local_b30 = &PTR__token_base_00373e68;
  pptVar6 = &local_b38;
  __l_07._M_len = 2;
  __l_07._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_678,__l_07,
             &local_fa1);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374298;
  p_Var7 = &local_678;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_b48 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b48->line_num = 1;
  local_b48->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_b48[1]._vptr_token_base = 7;
  local_b40 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_b40[1] = 0;
  *local_b40 = &PTR__token_base_00373e68;
  pptVar6 = &local_b48;
  __l_08._M_len = 2;
  __l_08._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_6c8,__l_08,
             &local_fa2);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374bb8;
  p_Var7 = &local_6c8;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_b60 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b60->line_num = 1;
  local_b60->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_b60[1]._vptr_token_base = 4;
  local_b58 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b58[1] = 1;
  *local_b58 = &PTR__token_expr_00375700;
  local_b58[2] = 0;
  local_ef0.mRoot = (tree_node *)0x0;
  local_b50 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_b50[1] = 0;
  *local_b50 = &PTR__token_base_00373e68;
  pptVar6 = &local_b60;
  __l_09._M_len = 3;
  __l_09._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_718,__l_09,
             &local_fa3);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374c18;
  p_Var7 = &local_718;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_b78 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b78->line_num = 1;
  local_b78->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_b78[1]._vptr_token_base = 0xd;
  local_b70 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b70[1] = 1;
  *local_b70 = &PTR__token_expr_00375700;
  local_b70[2] = 0;
  local_ef8.mRoot = (tree_node *)0x0;
  local_b68 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_b68[1] = 0;
  *local_b68 = &PTR__token_base_00373e68;
  pptVar6 = &local_b78;
  __l_10._M_len = 3;
  __l_10._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_768,__l_10,
             &local_fa4);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374c78;
  p_Var7 = &local_768;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var7,pmVar4);
  local_b88 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var7);
  local_b88->line_num = 1;
  local_b88->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_b88[1]._vptr_token_base = 0xe;
  local_b80 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var7);
  local_b80[1] = 0;
  *local_b80 = &PTR__token_base_00373e68;
  pptVar6 = &local_b88;
  __l_11._M_len = 2;
  __l_11._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_80,__l_11,
             &local_fa5);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374cd8;
  p_Var8 = &local_80;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_ba0 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_ba0->line_num = 1;
  local_ba0->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_ba0[1]._vptr_token_base = 0xf;
  local_b98 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_b98[1] = 1;
  *local_b98 = &PTR__token_expr_00375700;
  local_b98[2] = 0;
  local_f00.mRoot = (tree_node *)0x0;
  local_b90 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_b90[1] = 0;
  *local_b90 = &PTR__token_base_00373e68;
  pptVar6 = &local_ba0;
  __l_12._M_len = 3;
  __l_12._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_d0,__l_12,
             &local_fa6);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374d38;
  p_Var8 = &local_d0;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_bb8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_bb8->line_num = 1;
  local_bb8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_bb8[1]._vptr_token_base = 0x10;
  local_bb0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_bb0[1] = 1;
  *local_bb0 = &PTR__token_expr_00375700;
  local_bb0[2] = 0;
  local_f08.mRoot = (tree_node *)0x0;
  local_ba8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_ba8[1] = 0;
  *local_ba8 = &PTR__token_base_00373e68;
  pptVar6 = &local_bb8;
  __l_13._M_len = 3;
  __l_13._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_120,__l_13,
             &local_fa7);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374d98;
  p_Var8 = &local_120;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_bc8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_bc8->line_num = 1;
  local_bc8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_bc8[1]._vptr_token_base = 0x11;
  local_bc0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_bc0[1] = 0;
  *local_bc0 = &PTR__token_base_00373e68;
  pptVar6 = &local_bc8;
  __l_14._M_len = 2;
  __l_14._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_170,__l_14,
             &local_fa8);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374df8;
  p_Var8 = &local_170;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_be0 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_be0->line_num = 1;
  local_be0->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_be0[1]._vptr_token_base = 0x12;
  local_bd8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_bd8[1] = 1;
  *local_bd8 = &PTR__token_expr_00375700;
  local_bd8[2] = 0;
  local_f10.mRoot = (tree_node *)0x0;
  local_bd0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_bd0[1] = 0;
  *local_bd0 = &PTR__token_base_00373e68;
  pptVar6 = &local_be0;
  __l_15._M_len = 3;
  __l_15._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_1c0,__l_15,
             &local_fa9);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374e58;
  p_Var8 = &local_1c0;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_bf8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_bf8->line_num = 1;
  local_bf8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_bf8[1]._vptr_token_base = 0x14;
  local_bf0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_bf0[1] = 1;
  *local_bf0 = &PTR__token_expr_00375700;
  local_bf0[2] = 0;
  local_f18.mRoot = (tree_node *)0x0;
  local_be8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_be8[1] = 0;
  *local_be8 = &PTR__token_base_00373e68;
  pptVar6 = &local_bf8;
  __l_16._M_len = 3;
  __l_16._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_210,__l_16,
             &local_faa);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374eb8;
  p_Var8 = &local_210;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_c08 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c08->line_num = 1;
  local_c08->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_c08[1]._vptr_token_base = 0x13;
  local_c00 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c00[1] = 0;
  *local_c00 = &PTR__token_base_00373e68;
  pptVar6 = &local_c08;
  __l_17._M_len = 2;
  __l_17._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_260,__l_17,
             &local_fab);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374f20;
  p_Var8 = &local_260;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_c20 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c20->line_num = 1;
  local_c20->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_c20[1]._vptr_token_base = 0x15;
  local_c18 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c18[1] = 1;
  *local_c18 = &PTR__token_expr_00375700;
  local_c18[2] = 0;
  local_f20.mRoot = (tree_node *)0x0;
  local_c10 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c10[1] = 0;
  *local_c10 = &PTR__token_base_00373e68;
  pptVar6 = &local_c20;
  __l_18._M_len = 3;
  __l_18._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_2b0,__l_18,
             &local_fac);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374f80;
  p_Var8 = &local_2b0;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_e78.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  (local_e78.mDat)->refcount = 1;
  *(undefined ***)local_e78.mDat = &PTR__token_base_00374248;
  *(undefined4 *)&(local_e78.mDat)->data = 0x15;
  local_e70 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_e70[1] = 1;
  *local_e70 = &PTR__token_expr_00375700;
  local_e70[2] = 0;
  local_f28.mRoot = (tree_node *)0x0;
  local_e68 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_e68[1] = 1;
  *local_e68 = &PTR__token_base_00374248;
  *(undefined4 *)(local_e68 + 2) = 0xc;
  local_e60 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_e60[1] = 1;
  *local_e60 = &PTR__token_expr_00375700;
  local_e60[2] = 0;
  local_f30.mRoot = (tree_node *)0x0;
  local_e58 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_e58[1] = 0;
  *local_e58 = &PTR__token_base_00373e68;
  paVar3 = &local_e78;
  __l_19._M_len = 5;
  __l_19._M_array = (iterator)paVar3;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_300,__l_19,
             &local_fad);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)paVar3);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00374fe0;
  p_Var8 = &local_300;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_ea0.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  (local_ea0.mDat)->refcount = 1;
  *(undefined ***)local_ea0.mDat = &PTR__token_base_00374248;
  *(undefined4 *)&(local_ea0.mDat)->data = 0x16;
  local_e98 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_e98[1] = 1;
  *local_e98 = &PTR__token_expr_00375700;
  local_e98[2] = 0;
  local_f38.mRoot = (tree_node *)0x0;
  local_e90 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_e90[1] = 1;
  *local_e90 = &PTR__token_base_00374248;
  *(undefined4 *)(local_e90 + 2) = 0x17;
  local_e88 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_e88[1] = 1;
  *local_e88 = &PTR__token_expr_00375700;
  local_e88[2] = 0;
  local_f40.mRoot = (tree_node *)0x0;
  local_e80 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_e80[1] = 0;
  *local_e80 = &PTR__token_base_00373e68;
  paVar3 = &local_ea0;
  __l_20._M_len = 5;
  __l_20._M_array = (iterator)paVar3;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_350,__l_20,
             &local_fae);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)paVar3);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00375040;
  p_Var8 = &local_350;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_dd8.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  (local_dd8.mDat)->refcount = 1;
  *(undefined ***)local_dd8.mDat = &PTR__token_base_00374248;
  *(undefined4 *)&(local_dd8.mDat)->data = 0x16;
  local_dd0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_dd0[1] = 1;
  *local_dd0 = &PTR__token_expr_00375700;
  local_dd0[2] = 0;
  local_f48.mRoot = (tree_node *)0x0;
  local_dc8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_dc8[1] = 1;
  *local_dc8 = &PTR__token_base_00374248;
  *(undefined4 *)(local_dc8 + 2) = 0x17;
  local_dc0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_dc0[1] = 1;
  *local_dc0 = &PTR__token_expr_00375700;
  local_dc0[2] = 0;
  local_f50.mRoot = (tree_node *)0x0;
  local_db8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_db8[1] = 1;
  *local_db8 = &PTR__token_base_00374248;
  *(undefined4 *)(local_db8 + 2) = 0xc;
  local_db0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_db0[1] = 1;
  *local_db0 = &PTR__token_expr_00375700;
  local_db0[2] = 0;
  local_f58.mRoot = (tree_node *)0x0;
  local_da8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_da8[1] = 0;
  *local_da8 = &PTR__token_base_00373e68;
  paVar3 = &local_dd8;
  __l_21._M_len = 7;
  __l_21._M_array = (iterator)paVar3;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_3a0,__l_21,
             &local_faf);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)paVar3);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003750a0;
  p_Var8 = &local_3a0;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_c30 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c30->line_num = 1;
  local_c30->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_c30[1]._vptr_token_base = 0x18;
  local_c28 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c28[1] = 0;
  *local_c28 = &PTR__token_base_00373e68;
  pptVar6 = &local_c30;
  __l_22._M_len = 2;
  __l_22._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_3f0,__l_22,
             &local_fb0);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00375100;
  p_Var8 = &local_3f0;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_c40 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c40->line_num = 1;
  local_c40->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_c40[1]._vptr_token_base = 0x19;
  local_c38 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c38[1] = 0;
  *local_c38 = &PTR__token_base_00373e68;
  pptVar6 = &local_c40;
  __l_23._M_len = 2;
  __l_23._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_7b8,__l_23,
             &local_fb1);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00375160;
  p_Var8 = &local_7b8;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_c58 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c58->line_num = 1;
  local_c58->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_c58[1]._vptr_token_base = 0x1a;
  local_c50 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c50[1] = 1;
  *local_c50 = &PTR__token_expr_00375700;
  local_c50[2] = 0;
  local_f60.mRoot = (tree_node *)0x0;
  local_c48 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c48[1] = 0;
  *local_c48 = &PTR__token_base_00373e68;
  pptVar6 = &local_c58;
  __l_24._M_len = 3;
  __l_24._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_808,__l_24,
             &local_fb2);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003751c0;
  p_Var8 = &local_808;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_c78 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c78->line_num = 1;
  local_c78->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_c78[1]._vptr_token_base = 0x1a;
  local_c70 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c70[1] = 1;
  *local_c70 = &PTR__token_expr_00375700;
  local_c70[2] = 0;
  local_f68.mRoot = (tree_node *)0x0;
  local_c68 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c68[1] = 1;
  *local_c68 = &PTR__token_base_00374248;
  *(undefined4 *)(local_c68 + 2) = 0x1b;
  local_c60 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c60[1] = 0;
  *local_c60 = &PTR__token_base_00373e68;
  pptVar6 = &local_c78;
  __l_25._M_len = 4;
  __l_25._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_858,__l_25,
             &local_fb3);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003751c0;
  p_Var8 = &local_858;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_c90 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c90->line_num = 1;
  local_c90->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_c90[1]._vptr_token_base = 0x1c;
  local_c88 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_c88[1] = 1;
  *local_c88 = &PTR__token_expr_00375700;
  local_c88[2] = 0;
  local_f70.mRoot = (tree_node *)0x0;
  local_c80 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c80[1] = 0;
  *local_c80 = &PTR__token_base_00373e68;
  pptVar6 = &local_c90;
  __l_26._M_len = 3;
  __l_26._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_8a8,__l_26,
             &local_fb4);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00375220;
  p_Var8 = &local_8a8;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_ca0 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_ca0->line_num = 1;
  local_ca0->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_ca0[1]._vptr_token_base = 0x1c;
  local_c98 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_c98[1] = 0;
  *local_c98 = &PTR__token_base_00373e68;
  pptVar6 = &local_ca0;
  __l_27._M_len = 2;
  __l_27._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_8f8,__l_27,
             &local_fb5);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00375280;
  p_Var8 = &local_8f8;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_cb8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_cb8->line_num = 1;
  local_cb8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_cb8[1]._vptr_token_base = 5;
  local_cb0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_cb0[1] = 1;
  *local_cb0 = &PTR__token_expr_00375700;
  local_cb0[2] = 0;
  local_f78.mRoot = (tree_node *)0x0;
  local_ca8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_ca8[1] = 0;
  *local_ca8 = &PTR__token_base_00373e68;
  pptVar6 = &local_cb8;
  __l_28._M_len = 3;
  __l_28._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_948,__l_28,
             &local_fb6);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003752e0;
  p_Var8 = &local_948;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_d20 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_d20->line_num = 1;
  local_d20->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_d20[1]._vptr_token_base = 5;
  local_d18 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_d18[1] = 1;
  *local_d18 = &PTR__token_expr_00375700;
  local_d18[2] = 0;
  local_f80.mRoot = (tree_node *)0x0;
  local_d10 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_d10[1] = 1;
  *local_d10 = &PTR__token_base_00374248;
  *(undefined4 *)(local_d10 + 2) = 6;
  local_d08 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_d08[1] = 1;
  *local_d08 = &PTR__token_expr_00375700;
  local_d08[2] = 0;
  local_f88.mRoot = (tree_node *)0x0;
  local_d00 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_d00[1] = 0;
  *local_d00 = &PTR__token_base_00373e68;
  pptVar6 = &local_d20;
  __l_29._M_len = 5;
  __l_29._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_998,__l_29,
             &local_fb7);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003752e0;
  p_Var8 = &local_998;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_cc8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_cc8->line_num = 1;
  local_cc8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_cc8[1]._vptr_token_base = 0x1d;
  local_cc0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_cc0[1] = 0;
  *local_cc0 = &PTR__token_base_00373e68;
  pptVar6 = &local_cc8;
  __l_30._M_len = 2;
  __l_30._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_9e8,__l_30,
             &local_fb8);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00375340;
  p_Var8 = &local_9e8;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_ce0 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_ce0->line_num = 1;
  local_ce0->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_ce0[1]._vptr_token_base = 0x1e;
  local_cd8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_cd8[1] = 1;
  *local_cd8 = &PTR__token_expr_00375700;
  local_cd8[2] = 0;
  local_f90.mRoot = (tree_node *)0x0;
  local_cd0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_cd0[1] = 0;
  *local_cd0 = &PTR__token_base_00373e68;
  pptVar6 = &local_ce0;
  __l_31._M_len = 3;
  __l_31._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_a38,__l_31,
             &local_fb9);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_003753a0;
  p_Var8 = &local_a38;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var8,pmVar4);
  local_cf8 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_cf8->line_num = 1;
  local_cf8->_vptr_token_base = (_func_int **)&PTR__token_base_00374248;
  *(undefined4 *)&local_cf8[1]._vptr_token_base = 0x1f;
  local_cf0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var8);
  local_cf0[1] = 1;
  *local_cf0 = &PTR__token_expr_00375700;
  local_cf0[2] = 0;
  local_f98.mRoot = (tree_node *)0x0;
  local_ce8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var8);
  local_ce8[1] = 0;
  *local_ce8 = &PTR__token_base_00373e68;
  pptVar6 = &local_cf8;
  __l_32._M_len = 3;
  __l_32._M_array = pptVar6;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_a88,__l_32,
             &local_fba);
  pmVar4 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)pptVar6);
  pmVar4->_vptr_method_base = (_func_int **)&PTR__method_base_00375400;
  translator_type::add_method
            (this_03,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_a88,pmVar4
            );
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_a88);
  tree_type<cs::token_base_*>::~tree_type(&local_f98);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_a38);
  tree_type<cs::token_base_*>::~tree_type(&local_f90);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_9e8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_998);
  tree_type<cs::token_base_*>::~tree_type(&local_f88);
  tree_type<cs::token_base_*>::~tree_type(&local_f80);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_948);
  tree_type<cs::token_base_*>::~tree_type(&local_f78);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_8f8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_8a8);
  tree_type<cs::token_base_*>::~tree_type(&local_f70);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_858);
  tree_type<cs::token_base_*>::~tree_type(&local_f68);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_808);
  tree_type<cs::token_base_*>::~tree_type(&local_f60);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_7b8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_3f0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_3a0);
  tree_type<cs::token_base_*>::~tree_type(&local_f58);
  tree_type<cs::token_base_*>::~tree_type(&local_f50);
  tree_type<cs::token_base_*>::~tree_type(&local_f48);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_350);
  tree_type<cs::token_base_*>::~tree_type(&local_f40);
  tree_type<cs::token_base_*>::~tree_type(&local_f38);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_300);
  tree_type<cs::token_base_*>::~tree_type(&local_f30);
  tree_type<cs::token_base_*>::~tree_type(&local_f28);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_2b0);
  tree_type<cs::token_base_*>::~tree_type(&local_f20);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_260);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_210);
  tree_type<cs::token_base_*>::~tree_type(&local_f18);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_1c0);
  tree_type<cs::token_base_*>::~tree_type(&local_f10);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_170);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_120);
  tree_type<cs::token_base_*>::~tree_type(&local_f08);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_d0);
  tree_type<cs::token_base_*>::~tree_type(&local_f00);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_80);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_768);
  tree_type<cs::token_base_*>::~tree_type(&local_ef8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_718);
  tree_type<cs::token_base_*>::~tree_type(&local_ef0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_6c8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_678);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_628);
  tree_type<cs::token_base_*>::~tree_type(&local_ee8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_5d8);
  tree_type<cs::token_base_*>::~tree_type(&local_ee0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_588);
  tree_type<cs::token_base_*>::~tree_type(&local_ed8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_538);
  tree_type<cs::token_base_*>::~tree_type(&local_ed0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_4e8);
  tree_type<cs::token_base_*>::~tree_type(&local_ec8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_498);
  tree_type<cs::token_base_*>::~tree_type(&local_ec0);
  tree_type<cs::token_base_*>::~tree_type(&local_eb8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_448);
  tree_type<cs::token_base_*>::~tree_type(&local_eb0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e28);
  tree_type<cs::token_base_*>::~tree_type(&local_ea8);
  lVar2 = *(long *)(*(long *)this + 0x10);
  local_e28._0_8_ = (element_type *)0x0;
  local_e28._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e10 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:511:29)>
              ::_M_invoke;
  local_e18 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:511:29)>
              ::_M_manager;
  local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&char::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d30,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::char_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[5]>
                     ((domain_manager *)(lVar2 + 0x30),(char (*) [5])0x2f4967,
                      (function<cs_impl::any_()> *)local_e28,(type_index *)&local_80,
                      (namespace_t *)&local_d30);
  local_448._M_unused._M_object = (void *)0x0;
  local_448._8_8_ = 0;
  local_430 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:513:31)>
              ::_M_invoke;
  local_438 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:513:31)>
              ::_M_manager;
  local_d0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&numeric::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d40,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::number_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar5,(char (*) [7])0x2f159b,(function<cs_impl::any_()> *)&local_448,
                      (type_index *)&local_d0,(namespace_t *)&local_d40);
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_480 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:515:32)>
              ::_M_invoke;
  local_488 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:515:32)>
              ::_M_manager;
  local_120._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&numeric::typeinfo;
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar5,(char (*) [8])0x30304c,(function<cs_impl::any_()> *)&local_498,
                      (type_index *)&local_120);
  local_4e8._M_unused._M_object = (void *)0x0;
  local_4e8._8_8_ = 0;
  local_4d0 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:516:30)>
              ::_M_invoke;
  local_4d8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:516:30)>
              ::_M_manager;
  local_170._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&numeric::typeinfo;
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar5,(char (*) [6])0x2f10f0,(function<cs_impl::any_()> *)&local_4e8,
                      (type_index *)&local_170);
  local_538._M_unused._M_object = (void *)0x0;
  local_538._8_8_ = 0;
  local_520 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:517:32)>
              ::_M_invoke;
  local_528 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:517:32)>
              ::_M_manager;
  local_1c0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&bool::typeinfo;
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar5,(char (*) [8])0x2f495b,(function<cs_impl::any_()> *)&local_538,
                      (type_index *)&local_1c0);
  local_588._M_unused._M_object = (void *)0x0;
  local_588._8_8_ = 0;
  local_570 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:518:32)>
              ::_M_invoke;
  local_578 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:518:32)>
              ::_M_manager;
  local_210._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&pointer::typeinfo;
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar5,(char (*) [8])0x2f075a,(function<cs_impl::any_()> *)&local_588,
                      (type_index *)&local_210);
  local_5d8._M_unused._M_object = (void *)0x0;
  local_5d8._8_8_ = 0;
  local_5c0 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:519:31)>
              ::_M_invoke;
  local_5c8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:519:31)>
              ::_M_manager;
  local_260._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&std::__cxx11::string::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d50,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::string_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar5,(char (*) [7])0x2f2d58,(function<cs_impl::any_()> *)&local_5d8,
                      (type_index *)&local_260,(namespace_t *)&local_d50);
  local_628._M_unused._M_object = (void *)0x0;
  local_628._8_8_ = 0;
  local_610 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:521:29)>
              ::_M_invoke;
  local_618 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:521:29)>
              ::_M_manager;
  local_2b0._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)&std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d60,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::list_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar5,(char (*) [5])0x2f493e,(function<cs_impl::any_()> *)&local_628,
                      (type_index *)&local_2b0,(namespace_t *)&local_d60);
  local_678._M_unused._M_object = (void *)0x0;
  local_678._8_8_ = 0;
  local_660 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:522:30)>
              ::_M_invoke;
  local_668 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:522:30)>
              ::_M_manager;
  local_300._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)&std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d70,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::array_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar5,(char (*) [6])0x2f5570,(function<cs_impl::any_()> *)&local_678,
                      (type_index *)&local_300,(namespace_t *)&local_d70);
  local_6c8._M_unused._M_object = (void *)0x0;
  local_6c8._8_8_ = 0;
  local_6b0 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:524:29)>
              ::_M_invoke;
  local_6b8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:524:29)>
              ::_M_manager;
  local_350._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)&std::pair<cs_impl::any,cs_impl::any>::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d80,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::pair_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar5,(char (*) [5])0x3024ca,(function<cs_impl::any_()> *)&local_6c8,
                      (type_index *)&local_350,(namespace_t *)&local_d80);
  local_718._M_unused._M_object = (void *)0x0;
  local_718._8_8_ = 0;
  local_700 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:526:33)>
              ::_M_invoke;
  local_708 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:526:33)>
              ::_M_manager;
  local_3a0._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       &phmap::
        flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
        ::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d90,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::hash_set_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar5,(char (*) [9])0x2f3a03,(function<cs_impl::any_()> *)&local_718,
                      (type_index *)&local_3a0,(namespace_t *)&local_d90);
  local_768._M_unused._M_object = (void *)0x0;
  local_768._8_8_ = 0;
  local_750 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:528:33)>
              ::_M_invoke;
  local_758 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:528:33)>
              ::_M_manager;
  local_3f0._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       &phmap::
        flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
        ::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_da0,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::hash_map_ext);
  pdVar5 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar5,(char (*) [9])0x2f491c,(function<cs_impl::any_()> *)&local_768,
                      (type_index *)&local_3f0,(namespace_t *)&local_da0);
  cs_impl::any::make_constant<std::shared_ptr<cs::context_type>,std::shared_ptr<cs::context_type>&>
            ((any *)&local_7b8,(shared_ptr<cs::context_type> *)this);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar5,(char (*) [8])0x3061e0,(var *)&local_7b8);
  local_d20 = (token_base *)CONCAT44(local_d20._4_4_,1);
  cs_impl::any::
  make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
            ((any *)&local_808,range,(types *)&local_d20);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar5,(char (*) [6])0x305b69,(var *)&local_808);
  make_cni<cs::numeric(&)(cs_impl::any_const&)>((cs *)&local_858,to_integer,true);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[11]>
                     (pdVar5,(char (*) [11])"to_integer",(var *)&local_858);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_8a8,to_string_abi_cxx11_,true)
  ;
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar5,(char (*) [10])"to_string",(var *)&local_8a8);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_8f8,type_abi_cxx11_,true);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar5,(char (*) [5])0x2f5341,(var *)&local_8f8);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_948,clone,false);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar5,(char (*) [6])"clone",(var *)&local_948);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_998,move,false);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar5,(char (*) [5])0x2f12b8,(var *)&local_998);
  make_cni<void(&)(cs_impl::any&,cs_impl::any&)>((cs *)&local_9e8,swap,true);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar5,(char (*) [5])"swap",(var *)&local_9e8);
  make_cni<bool(&)(cs::type_id_const&,cs::type_id_const&)>((cs *)&local_a38,is_a,true);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar5,(char (*) [5])"is_a",(var *)&local_a38);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            ((any *)&local_a88,(shared_ptr<cs::name_space> *)&cs_impl::except_ext);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar5,(char (*) [10])0x2f554f,(var *)&local_a88);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_dd8,(shared_ptr<cs::name_space> *)&cs_impl::iostream_ext);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[9]>
                     (pdVar5,(char (*) [9])"iostream",&local_dd8);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_e50,(shared_ptr<cs::name_space> *)&cs_impl::system_ext);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[7]>
                     (pdVar5,(char (*) [7])"system",&local_e50);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_e78,(shared_ptr<cs::name_space> *)&cs_impl::runtime_ext);
  pdVar5 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar5,(char (*) [8])"runtime",&local_e78);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_ea0,(shared_ptr<cs::name_space> *)&cs_impl::math_ext);
  domain_manager::add_buildin_var<char_const(&)[5]>(pdVar5,(char (*) [5])"math",&local_ea0);
  cs_impl::any::recycle(&local_ea0);
  cs_impl::any::recycle(&local_e78);
  cs_impl::any::recycle(&local_e50);
  cs_impl::any::recycle(&local_dd8);
  cs_impl::any::recycle((any *)&local_a88);
  cs_impl::any::recycle((any *)&local_a38);
  cs_impl::any::recycle((any *)&local_9e8);
  cs_impl::any::recycle((any *)&local_998);
  cs_impl::any::recycle((any *)&local_948);
  cs_impl::any::recycle((any *)&local_8f8);
  cs_impl::any::recycle((any *)&local_8a8);
  cs_impl::any::recycle((any *)&local_858);
  cs_impl::any::recycle((any *)&local_808);
  cs_impl::any::recycle((any *)&local_7b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_da0._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_768);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d90._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_718);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d80._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_6c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d70._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_678);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d60._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_628);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d50._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_5d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_588);
  std::_Function_base::~_Function_base((_Function_base *)&local_538);
  std::_Function_base::~_Function_base((_Function_base *)&local_4e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d40._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_448);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d30._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)local_e28);
  cVar9.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar9.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (context_t)cVar9.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

context_t create_context(const array &args)
	{
		cs_impl::init_extensions();
		context_t context = std::make_shared<context_type>();
		context->compiler = std::make_shared<compiler_type>(context);
		context->instance = std::make_shared<instance_type>(context, current_process->stack_size);
		context->cmd_args = cs::var::make_constant<cs::array>(args);
		// Init Grammars
		(*context->compiler)
		// Expression Grammar
		.add_method({new token_expr(tree_type<token_base *>()), new token_endline(0)},
		new method_expression)
		// Import Grammar
		.add_method({new token_action(action_types::import_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_import)
		.add_method({new token_action(action_types::import_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::as_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_import_as)
		// Package Grammar
		.add_method({new token_action(action_types::package_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_package)
		// Involve Grammar
		.add_method({new token_action(action_types::using_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_involve)
		// Var Grammar
		.add_method({new token_action(action_types::var_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_var)
		.add_method({new token_action(action_types::link_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_link)
		.add_method({new token_action(action_types::constant_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)},
		new method_constant)
		// End Grammar
		.add_method({new token_action(action_types::endblock_), new token_endline(0)}, new method_end)
		// Block Grammar
		.add_method({new token_action(action_types::block_), new token_endline(0)}, new method_block)
		// Namespace Grammar
		.add_method({new token_action(action_types::namespace_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_namespace)
		// If Grammar
		.add_method({new token_action(action_types::if_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_if)
		// Else Grammar
		.add_method({new token_action(action_types::else_), new token_endline(0)}, new method_else)
		// Switch Grammar
		.add_method({new token_action(action_types::switch_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_switch)
		// Case Grammar
		.add_method({new token_action(action_types::case_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_case)
		// Default Grammar
		.add_method({new token_action(action_types::default_), new token_endline(0)},
		new method_default)
		// While Grammar
		.add_method({new token_action(action_types::while_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_while)
		// Until Grammar
		.add_method({new token_action(action_types::until_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_until)
		// Loop Grammar
		.add_method({new token_action(action_types::loop_), new token_endline(0)}, new method_loop)
		// For Grammar
		.add_method({new token_action(action_types::for_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_for)
		.add_method({new token_action(action_types::for_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::do_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_for_do)
		.add_method({new token_action(action_types::foreach_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::in_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_foreach)
		.add_method({new token_action(action_types::foreach_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::in_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::do_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_foreach_do)
		// Break Grammar
		.add_method({new token_action(action_types::break_), new token_endline(0)}, new method_break)
		// Continue Grammar
		.add_method({new token_action(action_types::continue_), new token_endline(0)},
		new method_continue)
		// Function Grammar
		.add_method({new token_action(action_types::function_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_function)
		.add_method({new token_action(action_types::function_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::override_), new token_endline(0)},
		new method_function)
		// Return Grammar
		.add_method({new token_action(action_types::return_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_return)
		.add_method({new token_action(action_types::return_), new token_endline(0)},
		new method_return_no_value)
		// Struct Grammar
		.add_method({new token_action(action_types::struct_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_struct)
		.add_method({new token_action(action_types::struct_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::extends_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_struct)
		// Try Grammar
		.add_method({new token_action(action_types::try_), new token_endline(0)}, new method_try)
		// Catch Grammar
		.add_method({new token_action(action_types::catch_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_catch)
		// Throw Grammar
		.add_method({new token_action(action_types::throw_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_throw);
		// Init Runtime
		context->instance->storage
		// Internal Types
		.add_buildin_type("char", []() -> var { return var::make<char>('\0'); }, typeid(char),
		                  cs_impl::char_ext)
		.add_buildin_type("number", []() -> var { return var::make<numeric>(0); }, typeid(numeric),
		                  cs_impl::number_ext)
		.add_buildin_type("integer", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("float", []() -> var { return var::make<numeric>(0.0); }, typeid(numeric))
		.add_buildin_type("boolean", []() -> var { return var::make<boolean>(true); }, typeid(boolean))
		.add_buildin_type("pointer", []() -> var { return var::make<pointer>(null_pointer); }, typeid(pointer))
		.add_buildin_type("string", []() -> var { return var::make<string>(); }, typeid(string),
		                  cs_impl::string_ext)
		.add_buildin_type("list", []() -> var { return var::make<list>(); }, typeid(list), cs_impl::list_ext)
		.add_buildin_type("array", []() -> var { return var::make<array>(); }, typeid(array),
		                  cs_impl::array_ext)
		.add_buildin_type("pair", []() -> var { return var::make<pair>(numeric(0), numeric(0)); }, typeid(pair),
		                  cs_impl::pair_ext)
		.add_buildin_type("hash_set", []() -> var { return var::make<hash_set>(); }, typeid(hash_set),
		                  cs_impl::hash_set_ext)
		.add_buildin_type("hash_map", []() -> var { return var::make<hash_map>(); }, typeid(hash_map),
		                  cs_impl::hash_map_ext)
		// Context
		.add_buildin_var("context", var::make_constant<context_t>(context))
		// Add Internal Functions to storage
		.add_buildin_var("range", var::make_protect<callable>(range, callable::types::request_fold))
		.add_buildin_var("to_integer", make_cni(to_integer, true))
		.add_buildin_var("to_string", make_cni(to_string, true))
		.add_buildin_var("type", make_cni(type, true))
		.add_buildin_var("clone", make_cni(clone))
		.add_buildin_var("move", make_cni(move))
		.add_buildin_var("swap", make_cni(swap, true))
		.add_buildin_var("is_a", make_cni(is_a, true))
		// Add extensions to storage
		.add_buildin_var("exception", make_namespace(cs_impl::except_ext))
		.add_buildin_var("iostream", make_namespace(cs_impl::iostream_ext))
		.add_buildin_var("system", make_namespace(cs_impl::system_ext))
		.add_buildin_var("runtime", make_namespace(cs_impl::runtime_ext))
		.add_buildin_var("math", make_namespace(cs_impl::math_ext));
		return context;
	}